

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<std::_List_node<Assimp::STransformVecInfo>>::
construct<Assimp::STransformVecInfo,Assimp::STransformVecInfo>
          (new_allocator<std::_List_node<Assimp::STransformVecInfo>> *this,STransformVecInfo *__p,
          STransformVecInfo *__args)

{
  list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *plVar1;
  list<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_> *plVar2;
  _List_node_base *p_Var3;
  aiVector2D aVar4;
  aiTextureMapMode aVar5;
  aiTextureMapMode aVar6;
  uint uVar7;
  
  (__p->super_aiUVTransform).mRotation = (__args->super_aiUVTransform).mRotation;
  aVar4 = (__args->super_aiUVTransform).mScaling;
  (__p->super_aiUVTransform).mTranslation = (__args->super_aiUVTransform).mTranslation;
  (__p->super_aiUVTransform).mScaling = aVar4;
  aVar5 = __args->mapU;
  aVar6 = __args->mapV;
  uVar7 = __args->lockedPos;
  __p->uvIndex = __args->uvIndex;
  __p->mapU = aVar5;
  __p->mapV = aVar6;
  __p->lockedPos = uVar7;
  plVar1 = &__p->updateList;
  plVar2 = &__args->updateList;
  (__p->updateList).super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       (__args->updateList).
       super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node
       .super__List_node_base._M_next;
  p_Var3 = (__args->updateList).
           super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  (__p->updateList).super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = p_Var3;
  (__p->updateList).super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
  _M_impl._M_node._M_size =
       (__args->updateList).
       super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node
       ._M_size;
  if ((__args->updateList).
      super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)plVar2) {
    p_Var3->_M_next = (_List_node_base *)plVar1;
    ((plVar1->super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>)._M_impl
     ._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
    (__args->updateList).
    super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)plVar2;
    (__args->updateList).
    super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)plVar2;
    (__args->updateList).
    super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>._M_impl._M_node.
    _M_size = 0;
    return;
  }
  (__p->updateList).super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (__p->updateList).super__List_base<Assimp::TTUpdateInfo,_std::allocator<Assimp::TTUpdateInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  return;
}

Assistant:

STransformVecInfo() AI_NO_EXCEPT
    : uvIndex(0)
    , mapU(aiTextureMapMode_Wrap)
    , mapV(aiTextureMapMode_Wrap)
    , lockedPos(AI_TT_UV_IDX_LOCK_NONE) {
        // empty
    }